

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

int socketio_setaddresstype_option(SOCKET_IO_INSTANCE *socket_io_instance,char *addressType)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  char *addressType_local;
  SOCKET_IO_INSTANCE *socket_io_instance_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (socket_io_instance->io_state == IO_STATE_CLOSED) {
    iVar1 = strcmp(addressType,"DOMAIN_SOCKET");
    if (iVar1 == 0) {
      socket_io_instance->address_type = ADDRESS_TYPE_DOMAIN_SOCKET;
      l._4_4_ = 0;
    }
    else {
      iVar1 = strcmp(addressType,"IP_SOCKET");
      if (iVar1 == 0) {
        socket_io_instance->address_type = ADDRESS_TYPE_IP;
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
                    ,"socketio_setaddresstype_option",0x4ab,1,"Address type %s is not supported",
                    addressType);
        }
        l._4_4_ = 0x4ac;
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
                ,"socketio_setaddresstype_option",0x49c,1,
                "Socket\'s type can only be changed when in state \'IO_STATE_CLOSED\'.  Current state=%d"
                ,CONCAT44(uVar3,socket_io_instance->io_state));
    }
    l._4_4_ = 0x49d;
  }
  return l._4_4_;
}

Assistant:

static int socketio_setaddresstype_option(SOCKET_IO_INSTANCE* socket_io_instance, const char* addressType)
{
    int result;

    if (socket_io_instance->io_state != IO_STATE_CLOSED)
    {
        LogError("Socket's type can only be changed when in state 'IO_STATE_CLOSED'.  Current state=%d", socket_io_instance->io_state);
        result = MU_FAILURE;
    }
    else if (strcmp(addressType, OPTION_ADDRESS_TYPE_DOMAIN_SOCKET) == 0)
    {
        socket_io_instance->address_type = ADDRESS_TYPE_DOMAIN_SOCKET;
        result = 0;
    }
    else if (strcmp(addressType, OPTION_ADDRESS_TYPE_IP_SOCKET) == 0)
    {
        socket_io_instance->address_type = ADDRESS_TYPE_IP;
        result = 0;
    }
    else
    {
        LogError("Address type %s is not supported", addressType);
        result = MU_FAILURE;
    }

    return result;
}